

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist_tests.cpp
# Opt level: O0

void __thiscall
skiplist_tests::findearliestatleast_edge_test::test_method(findearliestatleast_edge_test *this)

{
  uint uVar1;
  bool bVar2;
  uint *puVar3;
  reference pvVar4;
  CBlockIndex *pCVar5;
  long in_FS_OFFSET;
  CBlockIndex *ret2;
  CBlockIndex *ret1;
  CBlockIndex *prev;
  uint timeMax;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<int> *__range1;
  CChain chain;
  list<CBlockIndex,_std::allocator<CBlockIndex>_> blocks;
  char *in_stack_fffffffffffff378;
  lazy_ostream *in_stack_fffffffffffff380;
  CBlockIndex *in_stack_fffffffffffff388;
  CBlockIndex *in_stack_fffffffffffff390;
  CChain *in_stack_fffffffffffff398;
  undefined7 in_stack_fffffffffffff3a0;
  undefined1 in_stack_fffffffffffff3a7;
  lazy_ostream *in_stack_fffffffffffff3a8;
  undefined7 in_stack_fffffffffffff3b0;
  undefined1 in_stack_fffffffffffff3b7;
  unit_test_log_t *in_stack_fffffffffffff3b8;
  unit_test_log_t *this_00;
  lazy_ostream *in_stack_fffffffffffff3d0;
  int height;
  CBlockIndex *in_stack_fffffffffffff3d8;
  int local_96c;
  reference local_968;
  uint *local_918;
  const_string local_900 [2];
  lazy_ostream local_8e0 [2];
  assertion_result local_8c0 [2];
  const_string local_888 [2];
  lazy_ostream local_868 [2];
  assertion_result local_848 [2];
  const_string local_810 [2];
  lazy_ostream local_7f0 [2];
  assertion_result local_7d0 [2];
  const_string local_798 [2];
  lazy_ostream local_778 [2];
  assertion_result local_758 [2];
  lazy_ostream local_71c;
  undefined1 local_708 [68];
  lazy_ostream local_6c4;
  undefined1 local_6b0 [68];
  lazy_ostream local_66c;
  undefined1 local_658 [68];
  lazy_ostream local_614;
  undefined1 local_600 [64];
  const_string local_5c0 [2];
  lazy_ostream local_5a0 [2];
  assertion_result local_580 [2];
  const_string local_548 [2];
  lazy_ostream local_528 [2];
  assertion_result local_508 [2];
  const_string local_4d0 [2];
  lazy_ostream local_4b0 [2];
  assertion_result local_490 [2];
  lazy_ostream local_454;
  undefined1 local_440 [68];
  lazy_ostream local_3fc;
  undefined1 local_3e8 [68];
  lazy_ostream local_3a4;
  undefined1 local_390 [68];
  lazy_ostream local_34c;
  undefined1 local_338 [64];
  const_string local_2f8 [2];
  lazy_ostream local_2d8 [2];
  assertion_result local_2b8 [2];
  lazy_ostream local_27c;
  undefined1 local_268 [68];
  lazy_ostream local_224;
  undefined1 local_210 [68];
  lazy_ostream local_1cc;
  undefined1 local_1b8 [68];
  lazy_ostream local_174;
  undefined1 local_160 [68];
  lazy_ostream local_11c;
  undefined1 local_108 [68];
  lazy_ostream local_c4;
  undefined1 local_b0 [88];
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_2c [36];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::list<CBlockIndex,_std::allocator<CBlockIndex>_>::list
            ((list<CBlockIndex,_std::allocator<CBlockIndex>_> *)in_stack_fffffffffffff378);
  memcpy(local_2c,&DAT_01c9cab4,0x24);
  local_58 = local_2c;
  local_50 = 9;
  local_918 = (uint *)std::initializer_list<int>::begin
                                ((initializer_list<int> *)in_stack_fffffffffffff378);
  puVar3 = (uint *)std::initializer_list<int>::end
                             ((initializer_list<int> *)in_stack_fffffffffffff388);
  for (; local_918 != puVar3; local_918 = local_918 + 1) {
    uVar1 = *local_918;
    bVar2 = std::__cxx11::list<CBlockIndex,_std::allocator<CBlockIndex>_>::empty
                      ((list<CBlockIndex,_std::allocator<CBlockIndex>_> *)in_stack_fffffffffffff378)
    ;
    if (bVar2) {
      local_968 = (reference)0x0;
    }
    else {
      local_968 = std::__cxx11::list<CBlockIndex,_std::allocator<CBlockIndex>_>::back
                            ((list<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                             in_stack_fffffffffffff380);
    }
    std::__cxx11::list<CBlockIndex,_std::allocator<CBlockIndex>_>::emplace_back<>
              ((list<CBlockIndex,_std::allocator<CBlockIndex>_> *)in_stack_fffffffffffff388);
    if (local_968 == (reference)0x0) {
      local_96c = 0;
    }
    else {
      local_96c = local_968->nHeight + 1;
    }
    pvVar4 = std::__cxx11::list<CBlockIndex,_std::allocator<CBlockIndex>_>::back
                       ((list<CBlockIndex,_std::allocator<CBlockIndex>_> *)in_stack_fffffffffffff380
                       );
    pvVar4->nHeight = local_96c;
    pvVar4 = std::__cxx11::list<CBlockIndex,_std::allocator<CBlockIndex>_>::back
                       ((list<CBlockIndex,_std::allocator<CBlockIndex>_> *)in_stack_fffffffffffff380
                       );
    pvVar4->pprev = local_968;
    std::__cxx11::list<CBlockIndex,_std::allocator<CBlockIndex>_>::back
              ((list<CBlockIndex,_std::allocator<CBlockIndex>_> *)in_stack_fffffffffffff380);
    CBlockIndex::BuildSkip(in_stack_fffffffffffff388);
    pvVar4 = std::__cxx11::list<CBlockIndex,_std::allocator<CBlockIndex>_>::back
                       ((list<CBlockIndex,_std::allocator<CBlockIndex>_> *)in_stack_fffffffffffff380
                       );
    pvVar4->nTimeMax = uVar1;
  }
  CChain::CChain((CChain *)in_stack_fffffffffffff378);
  std::__cxx11::list<CBlockIndex,_std::allocator<CBlockIndex>_>::back
            ((list<CBlockIndex,_std::allocator<CBlockIndex>_> *)in_stack_fffffffffffff380);
  CChain::SetTip(in_stack_fffffffffffff398,in_stack_fffffffffffff390);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff378);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff3b8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0),
               (size_t)in_stack_fffffffffffff3a8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff380,(char (*) [1])in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    pCVar5 = CChain::FindEarliestAtLeast
                       ((CChain *)in_stack_fffffffffffff3a8,(int64_t)in_stack_fffffffffffff3d8,
                        (int)((ulong)in_stack_fffffffffffff3d0 >> 0x20));
    local_c4._vptr_lazy_ostream._0_4_ = 0;
    in_stack_fffffffffffff388 = (CBlockIndex *)0x1d1f9c0;
    in_stack_fffffffffffff380 = &local_c4;
    in_stack_fffffffffffff378 = "chain.FindEarliestAtLeast(50, 0)->nHeight";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_b0,(undefined1 *)((long)&local_c4._vptr_lazy_ostream + 4),0xa1,1,2,
               &pCVar5->nHeight);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff378);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff378);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff3b8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0),
               (size_t)in_stack_fffffffffffff3a8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff380,(char (*) [1])in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    pCVar5 = CChain::FindEarliestAtLeast
                       ((CChain *)in_stack_fffffffffffff3a8,(int64_t)in_stack_fffffffffffff3d8,
                        (int)((ulong)in_stack_fffffffffffff3d0 >> 0x20));
    local_11c._vptr_lazy_ostream._0_4_ = 0;
    in_stack_fffffffffffff388 = (CBlockIndex *)0x1d1f9c0;
    in_stack_fffffffffffff380 = &local_11c;
    in_stack_fffffffffffff378 = "chain.FindEarliestAtLeast(100, 0)->nHeight";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_108,(undefined1 *)((long)&local_11c._vptr_lazy_ostream + 4),0xa2,1,2,
               &pCVar5->nHeight);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff378);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff378);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff3b8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0),
               (size_t)in_stack_fffffffffffff3a8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff380,(char (*) [1])in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    pCVar5 = CChain::FindEarliestAtLeast
                       ((CChain *)in_stack_fffffffffffff3a8,(int64_t)in_stack_fffffffffffff3d8,
                        (int)((ulong)in_stack_fffffffffffff3d0 >> 0x20));
    local_174._vptr_lazy_ostream._0_4_ = 3;
    in_stack_fffffffffffff388 = (CBlockIndex *)0x1bc001a;
    in_stack_fffffffffffff380 = &local_174;
    in_stack_fffffffffffff378 = "chain.FindEarliestAtLeast(150, 0)->nHeight";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_160,(undefined1 *)((long)&local_174._vptr_lazy_ostream + 4),0xa3,1,2,
               &pCVar5->nHeight);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff378);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff378);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff3b8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0),
               (size_t)in_stack_fffffffffffff3a8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff380,(char (*) [1])in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    pCVar5 = CChain::FindEarliestAtLeast
                       ((CChain *)in_stack_fffffffffffff3a8,(int64_t)in_stack_fffffffffffff3d8,
                        (int)((ulong)in_stack_fffffffffffff3d0 >> 0x20));
    local_1cc._vptr_lazy_ostream._0_4_ = 3;
    in_stack_fffffffffffff388 = (CBlockIndex *)0x1bc001a;
    in_stack_fffffffffffff380 = &local_1cc;
    in_stack_fffffffffffff378 = "chain.FindEarliestAtLeast(200, 0)->nHeight";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_1b8,(undefined1 *)((long)&local_1cc._vptr_lazy_ostream + 4),0xa4,1,2,
               &pCVar5->nHeight);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff378);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff378);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff3b8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0),
               (size_t)in_stack_fffffffffffff3a8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff380,(char (*) [1])in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    pCVar5 = CChain::FindEarliestAtLeast
                       ((CChain *)in_stack_fffffffffffff3a8,(int64_t)in_stack_fffffffffffff3d8,
                        (int)((ulong)in_stack_fffffffffffff3d0 >> 0x20));
    local_224._vptr_lazy_ostream._0_4_ = 6;
    in_stack_fffffffffffff388 = (CBlockIndex *)0x1e74689;
    in_stack_fffffffffffff380 = &local_224;
    in_stack_fffffffffffff378 = "chain.FindEarliestAtLeast(250, 0)->nHeight";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_210,(undefined1 *)((long)&local_224._vptr_lazy_ostream + 4),0xa5,1,2,
               &pCVar5->nHeight);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff378);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff378);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff3b8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0),
               (size_t)in_stack_fffffffffffff3a8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff380,(char (*) [1])in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    pCVar5 = CChain::FindEarliestAtLeast
                       ((CChain *)in_stack_fffffffffffff3a8,(int64_t)in_stack_fffffffffffff3d8,
                        (int)((ulong)in_stack_fffffffffffff3d0 >> 0x20));
    local_27c._vptr_lazy_ostream._0_4_ = 6;
    in_stack_fffffffffffff388 = (CBlockIndex *)0x1e74689;
    in_stack_fffffffffffff380 = &local_27c;
    in_stack_fffffffffffff378 = "chain.FindEarliestAtLeast(300, 0)->nHeight";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_268,(undefined1 *)((long)&local_27c._vptr_lazy_ostream + 4),0xa6,1,2,
               &pCVar5->nHeight);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff378);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff378);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff3b8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0),
               (size_t)in_stack_fffffffffffff3a8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
    CChain::FindEarliestAtLeast
              ((CChain *)in_stack_fffffffffffff3a8,(int64_t)in_stack_fffffffffffff3d8,
               (int)((ulong)in_stack_fffffffffffff3d0 >> 0x20));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff388,
               SUB81((ulong)in_stack_fffffffffffff380 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff380,(basic_cstring<const_char> *)in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    in_stack_fffffffffffff378 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2b8,local_2d8,local_2f8,0xa7,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff378);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff378);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff378);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff3b8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0),
               (size_t)in_stack_fffffffffffff3a8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff380,(char (*) [1])in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    pCVar5 = CChain::FindEarliestAtLeast
                       ((CChain *)in_stack_fffffffffffff3a8,(int64_t)in_stack_fffffffffffff3d8,
                        (int)((ulong)in_stack_fffffffffffff3d0 >> 0x20));
    local_34c._vptr_lazy_ostream._0_4_ = 0;
    in_stack_fffffffffffff388 = (CBlockIndex *)0x1d1f9c0;
    in_stack_fffffffffffff380 = &local_34c;
    in_stack_fffffffffffff378 = "chain.FindEarliestAtLeast(0, 0)->nHeight";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_338,(undefined1 *)((long)&local_34c._vptr_lazy_ostream + 4),0xa9,1,2,
               &pCVar5->nHeight);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff378);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff378);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff3b8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0),
               (size_t)in_stack_fffffffffffff3a8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff380,(char (*) [1])in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    pCVar5 = CChain::FindEarliestAtLeast
                       ((CChain *)in_stack_fffffffffffff3a8,(int64_t)in_stack_fffffffffffff3d8,
                        (int)((ulong)in_stack_fffffffffffff3d0 >> 0x20));
    local_3a4._vptr_lazy_ostream._0_4_ = 0;
    in_stack_fffffffffffff388 = (CBlockIndex *)0x1d1f9c0;
    in_stack_fffffffffffff380 = &local_3a4;
    in_stack_fffffffffffff378 = "chain.FindEarliestAtLeast(-1, 0)->nHeight";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_390,(undefined1 *)((long)&local_3a4._vptr_lazy_ostream + 4),0xaa,1,2,
               &pCVar5->nHeight);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff378);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff378);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff3b8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0),
               (size_t)in_stack_fffffffffffff3a8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff380,(char (*) [1])in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    std::numeric_limits<long>::min();
    pCVar5 = CChain::FindEarliestAtLeast
                       ((CChain *)in_stack_fffffffffffff3a8,(int64_t)in_stack_fffffffffffff3d8,
                        (int)((ulong)in_stack_fffffffffffff3d0 >> 0x20));
    local_3fc._vptr_lazy_ostream._0_4_ = 0;
    in_stack_fffffffffffff388 = (CBlockIndex *)0x1d1f9c0;
    in_stack_fffffffffffff380 = &local_3fc;
    in_stack_fffffffffffff378 =
         "chain.FindEarliestAtLeast(std::numeric_limits<int64_t>::min(), 0)->nHeight";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_3e8,(undefined1 *)((long)&local_3fc._vptr_lazy_ostream + 4),0xac,1,2,
               &pCVar5->nHeight);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff378);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff378);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff3b8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0),
               (size_t)in_stack_fffffffffffff3a8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff380,(char (*) [1])in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    std::numeric_limits<unsigned_int>::max();
    pCVar5 = CChain::FindEarliestAtLeast
                       ((CChain *)in_stack_fffffffffffff3a8,(int64_t)in_stack_fffffffffffff3d8,
                        (int)((ulong)in_stack_fffffffffffff3d0 >> 0x20));
    local_454._vptr_lazy_ostream._0_4_ = 0;
    in_stack_fffffffffffff388 = (CBlockIndex *)0x1d1f9c0;
    in_stack_fffffffffffff380 = &local_454;
    in_stack_fffffffffffff378 =
         "chain.FindEarliestAtLeast(-int64_t(std::numeric_limits<unsigned int>::max()) - 1, 0)->nHeight"
    ;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_440,(undefined1 *)((long)&local_454._vptr_lazy_ostream + 4),0xad,1,2,
               &pCVar5->nHeight);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff378);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff378);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff3b8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0),
               (size_t)in_stack_fffffffffffff3a8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
    std::numeric_limits<long>::max();
    CChain::FindEarliestAtLeast
              ((CChain *)in_stack_fffffffffffff3a8,(int64_t)in_stack_fffffffffffff3d8,
               (int)((ulong)in_stack_fffffffffffff3d0 >> 0x20));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff388,
               SUB81((ulong)in_stack_fffffffffffff380 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff380,(basic_cstring<const_char> *)in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    in_stack_fffffffffffff378 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_490,local_4b0,local_4d0,0xae,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff378);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff378);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff378);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff3b8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0),
               (size_t)in_stack_fffffffffffff3a8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
    std::numeric_limits<unsigned_int>::max();
    CChain::FindEarliestAtLeast
              ((CChain *)in_stack_fffffffffffff3a8,(int64_t)in_stack_fffffffffffff3d8,
               (int)((ulong)in_stack_fffffffffffff3d0 >> 0x20));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff388,
               SUB81((ulong)in_stack_fffffffffffff380 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff380,(basic_cstring<const_char> *)in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    in_stack_fffffffffffff378 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_508,local_528,local_548,0xaf,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff378);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff378);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff378);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff3b8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0),
               (size_t)in_stack_fffffffffffff3a8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
    std::numeric_limits<unsigned_int>::max();
    CChain::FindEarliestAtLeast
              ((CChain *)in_stack_fffffffffffff3a8,(int64_t)in_stack_fffffffffffff3d8,
               (int)((ulong)in_stack_fffffffffffff3d0 >> 0x20));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff388,
               SUB81((ulong)in_stack_fffffffffffff380 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff380,(basic_cstring<const_char> *)in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    in_stack_fffffffffffff378 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_580,local_5a0,local_5c0,0xb0,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff378);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff378);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff378);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff3b8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0),
               (size_t)in_stack_fffffffffffff3a8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff380,(char (*) [1])in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    pCVar5 = CChain::FindEarliestAtLeast
                       ((CChain *)in_stack_fffffffffffff3a8,(int64_t)in_stack_fffffffffffff3d8,
                        (int)((ulong)in_stack_fffffffffffff3d0 >> 0x20));
    local_614._vptr_lazy_ostream._0_4_ = 0;
    in_stack_fffffffffffff388 = (CBlockIndex *)0x1d1f9c0;
    in_stack_fffffffffffff380 = &local_614;
    in_stack_fffffffffffff378 = "chain.FindEarliestAtLeast(0, -1)->nHeight";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_600,(undefined1 *)((long)&local_614._vptr_lazy_ostream + 4),0xb2,1,2,
               &pCVar5->nHeight);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff378);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff378);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff3b8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0),
               (size_t)in_stack_fffffffffffff3a8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff380,(char (*) [1])in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    pCVar5 = CChain::FindEarliestAtLeast
                       ((CChain *)in_stack_fffffffffffff3a8,(int64_t)in_stack_fffffffffffff3d8,
                        (int)((ulong)in_stack_fffffffffffff3d0 >> 0x20));
    local_66c._vptr_lazy_ostream._0_4_ = 0;
    in_stack_fffffffffffff388 = (CBlockIndex *)0x1d1f9c0;
    in_stack_fffffffffffff380 = &local_66c;
    in_stack_fffffffffffff378 = "chain.FindEarliestAtLeast(0, 0)->nHeight";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_658,(undefined1 *)((long)&local_66c._vptr_lazy_ostream + 4),0xb3,1,2,
               &pCVar5->nHeight);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff378);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff378);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff3b8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0),
               (size_t)in_stack_fffffffffffff3a8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff380,(char (*) [1])in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    pCVar5 = CChain::FindEarliestAtLeast
                       ((CChain *)in_stack_fffffffffffff3a8,(int64_t)in_stack_fffffffffffff3d8,
                        (int)((ulong)in_stack_fffffffffffff3d0 >> 0x20));
    local_6c4._vptr_lazy_ostream._0_4_ = 3;
    in_stack_fffffffffffff388 = (CBlockIndex *)0x1bc001a;
    in_stack_fffffffffffff380 = &local_6c4;
    in_stack_fffffffffffff378 = "chain.FindEarliestAtLeast(0, 3)->nHeight";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_6b0,(undefined1 *)((long)&local_6c4._vptr_lazy_ostream + 4),0xb4,1,2,
               &pCVar5->nHeight);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff378);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff378);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff3b8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0),
               (size_t)in_stack_fffffffffffff3a8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff380,(char (*) [1])in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    pCVar5 = CChain::FindEarliestAtLeast
                       ((CChain *)in_stack_fffffffffffff3a8,(int64_t)in_stack_fffffffffffff3d8,
                        (int)((ulong)in_stack_fffffffffffff3d0 >> 0x20));
    local_71c._vptr_lazy_ostream._0_4_ = 8;
    in_stack_fffffffffffff388 = (CBlockIndex *)0x1e9b1ad;
    in_stack_fffffffffffff380 = &local_71c;
    in_stack_fffffffffffff378 = "chain.FindEarliestAtLeast(0, 8)->nHeight";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_708,(undefined1 *)((long)&local_71c._vptr_lazy_ostream + 4),0xb5,1,2,
               &pCVar5->nHeight);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff378);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff378);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff3b8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0),
               (size_t)in_stack_fffffffffffff3a8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
    CChain::FindEarliestAtLeast
              ((CChain *)in_stack_fffffffffffff3a8,(int64_t)in_stack_fffffffffffff3d8,
               (int)((ulong)in_stack_fffffffffffff3d0 >> 0x20));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff388,
               SUB81((ulong)in_stack_fffffffffffff380 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff380,(basic_cstring<const_char> *)in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    in_stack_fffffffffffff378 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_758,local_778,local_798,0xb6,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff378);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff378);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CChain::FindEarliestAtLeast
            ((CChain *)in_stack_fffffffffffff3a8,(int64_t)in_stack_fffffffffffff3d8,
             (int)((ulong)in_stack_fffffffffffff3d0 >> 0x20));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff378);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff3b8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0),
               (size_t)in_stack_fffffffffffff3a8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff388,
               SUB81((ulong)in_stack_fffffffffffff380 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff380,(basic_cstring<const_char> *)in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    in_stack_fffffffffffff378 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_7d0,local_7f0,local_810,0xb9,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff378);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff378);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    height = (int)((ulong)in_stack_fffffffffffff3d0 >> 0x20);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff378);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff3b8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0),
               (size_t)in_stack_fffffffffffff3a8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
    in_stack_fffffffffffff3d8 =
         CChain::FindEarliestAtLeast
                   ((CChain *)in_stack_fffffffffffff3a8,(int64_t)in_stack_fffffffffffff3d8,height);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff388,
               SUB81((ulong)in_stack_fffffffffffff380 >> 0x38,0));
    in_stack_fffffffffffff3d0 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff380,(basic_cstring<const_char> *)in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    in_stack_fffffffffffff378 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_848,local_868,local_888,0xba,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff378);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff378);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  pCVar5 = CChain::FindEarliestAtLeast
                     ((CChain *)in_stack_fffffffffffff3a8,(int64_t)in_stack_fffffffffffff3d8,
                      (int)((ulong)in_stack_fffffffffffff3d0 >> 0x20));
  do {
    this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff378);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,(const_string *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0)
               ,(size_t)in_stack_fffffffffffff3a8,
               (const_string *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
    in_stack_fffffffffffff3b7 = false;
    if (199 < pCVar5->nTimeMax) {
      in_stack_fffffffffffff3b7 = pCVar5->nHeight == 4;
    }
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff388,
               SUB81((ulong)in_stack_fffffffffffff380 >> 0x38,0));
    in_stack_fffffffffffff3a8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff380,(basic_cstring<const_char> *)in_stack_fffffffffffff378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388,
               (pointer)in_stack_fffffffffffff380,(unsigned_long)in_stack_fffffffffffff378);
    in_stack_fffffffffffff378 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_8c0,local_8e0,local_900,0xbc,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff378);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff378);
    in_stack_fffffffffffff3a7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff3a7);
  CChain::~CChain((CChain *)in_stack_fffffffffffff378);
  std::__cxx11::list<CBlockIndex,_std::allocator<CBlockIndex>_>::~list
            ((list<CBlockIndex,_std::allocator<CBlockIndex>_> *)in_stack_fffffffffffff378);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(findearliestatleast_edge_test)
{
    std::list<CBlockIndex> blocks;
    for (const unsigned int timeMax : {100, 100, 100, 200, 200, 200, 300, 300, 300}) {
        CBlockIndex* prev = blocks.empty() ? nullptr : &blocks.back();
        blocks.emplace_back();
        blocks.back().nHeight = prev ? prev->nHeight + 1 : 0;
        blocks.back().pprev = prev;
        blocks.back().BuildSkip();
        blocks.back().nTimeMax = timeMax;
    }

    CChain chain;
    chain.SetTip(blocks.back());

    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(50, 0)->nHeight, 0);
    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(100, 0)->nHeight, 0);
    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(150, 0)->nHeight, 3);
    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(200, 0)->nHeight, 3);
    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(250, 0)->nHeight, 6);
    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(300, 0)->nHeight, 6);
    BOOST_CHECK(!chain.FindEarliestAtLeast(350, 0));

    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(0, 0)->nHeight, 0);
    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(-1, 0)->nHeight, 0);

    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(std::numeric_limits<int64_t>::min(), 0)->nHeight, 0);
    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(-int64_t(std::numeric_limits<unsigned int>::max()) - 1, 0)->nHeight, 0);
    BOOST_CHECK(!chain.FindEarliestAtLeast(std::numeric_limits<int64_t>::max(), 0));
    BOOST_CHECK(!chain.FindEarliestAtLeast(std::numeric_limits<unsigned int>::max(), 0));
    BOOST_CHECK(!chain.FindEarliestAtLeast(int64_t(std::numeric_limits<unsigned int>::max()) + 1, 0));

    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(0, -1)->nHeight, 0);
    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(0, 0)->nHeight, 0);
    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(0, 3)->nHeight, 3);
    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(0, 8)->nHeight, 8);
    BOOST_CHECK(!chain.FindEarliestAtLeast(0, 9));

    CBlockIndex* ret1 = chain.FindEarliestAtLeast(100, 2);
    BOOST_CHECK(ret1->nTimeMax >= 100 && ret1->nHeight == 2);
    BOOST_CHECK(!chain.FindEarliestAtLeast(300, 9));
    CBlockIndex* ret2 = chain.FindEarliestAtLeast(200, 4);
    BOOST_CHECK(ret2->nTimeMax >= 200 && ret2->nHeight == 4);
}